

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::TransformCache::~TransformCache(TransformCache *this)

{
  memory_resource *pmVar1;
  __node_base *p_Var2;
  
  p_Var2 = &(this->hashTable)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,p_Var2[1]._M_nxt,0x80,4);
  }
  std::
  _Hashtable<pbrt::Transform_*,_pbrt::Transform_*,_std::allocator<pbrt::Transform_*>,_std::__detail::_Identity,_std::equal_to<pbrt::Transform_*>,_pbrt::TransformHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->hashTable)._M_h);
  pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(&this->bufferResource);
  return;
}

Assistant:

TransformCache::~TransformCache() {
    for (const auto &iter : hashTable) {
        Transform *tptr = iter;
        alloc.delete_object(tptr);
    }
}